

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Parser * __thiscall
Catch::clara::detail::Parser::operator|(Parser *__return_storage_ptr__,Parser *this,ExeName *other)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  element_type *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_> local_60;
  vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_> local_48;
  
  local_78._M_pi =
       (this->m_exeName).m_name.
       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
    }
  }
  local_70 = (this->m_exeName).m_ref.
             super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  local_68._M_pi =
       (this->m_exeName).m_ref.
       super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
    }
  }
  std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::vector
            (&local_60,&this->m_options);
  std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::vector
            (&local_48,&this->m_args);
  peVar1 = (other->m_name).
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_78,
             &(other->m_name).
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  local_70 = (other->m_ref).
             super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_68,
             &(other->m_ref).
              super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  (__return_storage_ptr__->super_ParserBase)._vptr_ParserBase = (_func_int **)&PTR__Parser_00185d00;
  (__return_storage_ptr__->m_exeName).super_ComposableParserImpl<Catch::clara::detail::ExeName>.
  super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__ExeName_001855b0;
  (__return_storage_ptr__->m_exeName).m_name.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = peVar1;
  (__return_storage_ptr__->m_exeName).m_name.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = local_78._M_pi;
  if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
    }
  }
  (__return_storage_ptr__->m_exeName).m_ref.
  super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_70;
  (__return_storage_ptr__->m_exeName).m_ref.
  super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = local_68._M_pi;
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
    }
  }
  std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::vector
            (&__return_storage_ptr__->m_options,&local_60);
  std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::vector
            (&__return_storage_ptr__->m_args,&local_48);
  std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::~vector
            (&local_48);
  std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::~vector
            (&local_60);
  if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
  }
  if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

auto operator|( T const &other ) const -> Parser {
            return Parser( *this ) |= other;
        }